

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::AddProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  Var value_00;
  ScriptContext *scriptContext;
  uint uVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  PathTypeHandlerBase *pPVar8;
  PropertyRecord *pPVar9;
  SimpleDictionaryTypeHandler *this_00;
  PropertyAttributes PVar10;
  undefined7 in_register_00000081;
  DynamicObject *pDVar11;
  uint32 local_6c;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> WStack_68;
  uint32 indexVal;
  Var local_60;
  PropertyIndex local_52;
  PropertyValueInfo *pPStack_50;
  PropertyIndex index;
  DynamicObject *local_48;
  ScriptContext *local_40;
  uint local_38;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000081,attributes);
  local_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  pJVar1 = (local_40->super_ScriptContextBase).javascriptLibrary;
  pPStack_50 = info;
  BVar5 = GetDescriptor(this,propertyId,&local_52);
  local_48 = instance;
  if (BVar5 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x451,"(!GetDescriptor(propertyId, &index))",
                                "!GetDescriptor(propertyId, &index)");
    if (!bVar4) goto LAB_00cc52dc;
    *puVar7 = 0;
  }
  pDVar11 = local_48;
  BVar5 = ScriptContext::IsNumericPropertyId(local_40,propertyId,&local_6c);
  if (BVar5 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x452,
                                "(!scriptContext->IsNumericPropertyId(propertyId, &indexVal))",
                                "!scriptContext->IsNumericPropertyId(propertyId, &indexVal)");
    if (!bVar4) goto LAB_00cc52dc;
    *puVar7 = 0;
    pDVar11 = local_48;
  }
  if ((uint)this->propertyCount < 2) {
    local_60 = value;
    pPVar9 = ScriptContext::GetPropertyName(local_40,propertyId);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
              (&this->descriptors[this->propertyCount].Id,pPVar9);
    uVar3 = local_34;
    PVar10 = (PropertyAttributes)local_34;
    this->descriptors[this->propertyCount].field_1.Attributes = PVar10;
    if ((local_34 & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(pDVar11,false);
    }
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &stack0xffffffffffffff98,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
    scriptContext = local_40;
    local_38 = uVar3 & 0xff;
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)WStack_68.ptr,
               &this->super_DynamicTypeHandler,PVar10,propertyId,local_40);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&stack0xffffffffffffff98,&pJVar1->typesWithNoSpecialPropertyProtoChain);
    pDVar11 = local_48;
    PVar10 = (PropertyAttributes)local_38;
    local_38 = propertyId;
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<int>
              (WStack_68.ptr,&this->super_DynamicTypeHandler,PVar10,propertyId,scriptContext);
    value_00 = local_60;
    DynamicTypeHandler::SetSlotUnchecked(pDVar11,this->propertyCount,local_60);
    uVar3 = local_38;
    iVar6 = this->propertyCount;
    if (pPStack_50 != (PropertyValueInfo *)0x0) {
      pPStack_50->m_instance = &pDVar11->super_RecyclableObject;
      pPStack_50->m_propertyIndex = (PropertyIndex)iVar6;
      pPStack_50->m_attributes = (PropertyAttributes)local_34;
      pPStack_50->flags = InlineCacheNoFlags;
    }
    this->propertyCount = iVar6 + 1;
    if (((this->super_DynamicTypeHandler).flags != '\0') ||
       (BVar5 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                          (&pDVar11->super_RecyclableObject,local_38), BVar5 != 0)) {
      ScriptContext::InvalidateProtoCaches(local_40,uVar3);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar11,uVar3,value_00,possibleSideEffects);
    return 1;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x457,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
LAB_00cc52dc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pDVar11 = local_48;
  bVar4 = DoConvertToPathType((DynamicType *)(local_48->super_RecyclableObject).type.ptr);
  if (bVar4) {
    pPVar8 = ConvertToPathType(this,pDVar11);
    iVar6 = (*(pPVar8->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                      (pPVar8,pDVar11,(ulong)(uint)propertyId,value,(ulong)(byte)local_34,pPStack_50
                       ,(ulong)flags,0xf);
    return iVar6;
  }
  pPVar9 = ScriptContext::GetPropertyName(local_40,propertyId);
  this_00 = ConvertToSimpleDictionaryType(this,pDVar11);
  BVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
          AddProperty<Js::PropertyRecord_const*>
                    ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>
                      *)this_00,pDVar11,pPVar9,value,(byte)local_34,pPStack_50,flags,
                     possibleSideEffects);
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::AddProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();
#if DBG
        PropertyIndex index;
        uint32 indexVal;
        Assert(!GetDescriptor(propertyId, &index));
        Assert(!scriptContext->IsNumericPropertyId(propertyId, &indexVal));
#endif

        if (propertyCount >= sizeof(descriptors)/sizeof(SimplePropertyDescriptor))
        {
            Assert(propertyId != Constants::NoProperty);
            if (DoConvertToPathType(instance->GetDynamicType()))
            {
                return ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags);
            }
            else
            {
                PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
                return ConvertToSimpleDictionaryType(instance)->AddProperty(instance, propertyRecord, value, attributes, info, flags, possibleSideEffects);
            }
        }

        descriptors[propertyCount].Id = scriptContext->GetPropertyName(propertyId);
        descriptors[propertyCount].Attributes = attributes;
        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);

        SetSlotUnchecked(instance, propertyCount, value);
        PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(propertyCount), attributes);
        propertyCount++;

        if ((this->GetFlags() && IsPrototypeFlag)
            || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        return true;
    }